

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diplodocus.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  double dVar2;
  char local_2d8 [8];
  char hostname [128];
  undefined1 local_250 [8];
  BTCprov q;
  string fn;
  Conductor dipl;
  
  bzero(local_2d8,0x80);
  gethostname(local_2d8,0x80);
  std::__cxx11::string::string((string *)&q.field_0x200,*argv,(allocator *)local_250);
  std::__cxx11::string::assign((char *)&diplo::server_port_abi_cxx11_);
  diplo::onlyPartition = 0;
  diplo::nbOfClients = 1;
  std::__cxx11::string::assign((char *)&diplo::moleculeconffile_abi_cxx11_);
  std::__cxx11::string::assign(diplo::dbDir_abi_cxx11_);
  diplo::pause_int = 0;
  diplo::maxScope = 0;
  diplo::minScope = 0;
  diplo::network_buf_size = 0x38;
  diplo::PartitionerRange = 1;
  diplo::ProvTrigerON = 0;
  std::__cxx11::string::assign(diplo::statsDir_abi_cxx11_);
  std::__cxx11::string::assign((char *)&diplo::srcDir_abi_cxx11_);
  if (1 < argc) {
    std::__cxx11::string::assign(diplo::file_q_abi_cxx11_);
    if (argc == 3) {
      std::__cxx11::string::assign(diplo::file_p_abi_cxx11_);
    }
  }
  diplo::stopwatch_start();
  diplo::onlyPartition = 1;
  Conductor::Conductor((Conductor *)(fn.field_2._M_local_buf + 0xf));
  Conductor::LoadData((Conductor *)(fn.field_2._M_local_buf + 0xf));
  std::operator<<((ostream *)&std::cout,"Loading Time: ");
  dVar2 = diplo::stopwatch_get();
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Memory: ");
  diplo::memory_usage_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,(string *)local_250);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_250);
  queries::BTCprov::BTCprov((BTCprov *)local_250);
  if (diplo::file_q_abi_cxx11_._8_8_ != 0) {
    queries::BTCprov::TPDemo((BTCprov *)local_250);
  }
  queries::BTCprov::~BTCprov((BTCprov *)local_250);
  Conductor::~Conductor((Conductor *)(fn.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&q.field_0x200);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    char hostname[128];
    bzero(hostname,128);
    gethostname(hostname, 128);

    string fn = argv[0];
    diplo::server_port = "9999";
    diplo::onlyPartition = false;
    diplo::nbOfClients = 1;
    diplo::moleculeconffile = "";
    diplo::dbDir = "";
    diplo::pause_int = 0;
    diplo::maxScope = 0;
    diplo::minScope = 0;
    diplo::network_buf_size = 56;
    diplo::PartitionerRange = 1;
    diplo::ProvTrigerON = false;
    statsDir="btc/";



     diplo::srcDir = "../dataset/";
				
				if (argc >= 2) diplo::file_q = argv[1];
				if (argc == 3) diplo::file_p = argv[2];
				
				
    diplo::stopwatch_start();
    diplo::onlyPartition = true;
    Conductor dipl;
    dipl.LoadData();



    cout << "Loading Time: " << diplo::stopwatch_get() << endl;
    cout << "Memory: " << diplo::memory_usage() << endl;

    queries::BTCprov q;

		if (!diplo::file_q.empty()) { 
			q.TPDemo();	
			return 0;
		}

}